

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-ecc-impl.c
# Opt level: O0

int ndn_lite_default_ecdsa_verify
              (uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
              abstract_ecc_pub_key *abs_key,uint8_t ecdsa_type)

{
  int iVar1;
  uint32_t local_8c;
  int ret_val;
  uint32_t decoded_raw_signature_size;
  uint8_t raw_sig_temp_buf [64];
  uint8_t ecdsa_type_local;
  abstract_ecc_pub_key *abs_key_local;
  uint32_t sig_size_local;
  uint8_t *sig_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (sig_size < 0x49) {
    if (abs_key->key_size < 0x41) {
      if (ecdsa_type == ' ') {
        input_value_local._4_4_ =
             ndn_asn1_decode_ecdsa_signature(sig_value,sig_size,(uint8_t *)&ret_val,0x40,&local_8c);
        if (input_value_local._4_4_ == 0) {
          iVar1 = uECC_verify(abs_key->key_value,input_value,(uint8_t *)&ret_val);
          if (iVar1 == 0) {
            input_value_local._4_4_ = -0x1d;
          }
          else {
            input_value_local._4_4_ = 0;
          }
        }
      }
      else {
        input_value_local._4_4_ = -0x1a;
      }
    }
    else {
      input_value_local._4_4_ = -0x16;
    }
  }
  else {
    input_value_local._4_4_ = -0x17;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_lite_default_ecdsa_verify(const uint8_t* input_value, uint32_t input_size,
                              const uint8_t* sig_value, uint32_t sig_size,
                              const struct abstract_ecc_pub_key* abs_key, uint8_t ecdsa_type)
{

  if (sig_size > NDN_ASN1_ECDSA_MAX_ENCODED_SIG_SIZE)
    return NDN_SEC_WRONG_SIG_SIZE;
  if (abs_key->key_size > NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE)
    return NDN_SEC_WRONG_KEY_SIZE;
  if (ecdsa_type != NDN_ECDSA_CURVE_SECP256R1)
    return NDN_SEC_UNSUPPORT_CRYPTO_ALGO;

  uint8_t raw_sig_temp_buf[NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE];
  uint32_t decoded_raw_signature_size;
  int ret_val = ndn_asn1_decode_ecdsa_signature(sig_value, sig_size, raw_sig_temp_buf,
                                                NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE,
                                                &decoded_raw_signature_size);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  if (uECC_verify(abs_key->key_value, input_value, raw_sig_temp_buf) == 0) {
    return NDN_SEC_FAIL_VERIFY_SIG;
  }
  else
    return NDN_SUCCESS;
}